

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void gola_close(LexState *ls,VarInfo *vg)

{
  ushort uVar1;
  char *pcVar2;
  char in_DL;
  BCPos list;
  ulong uVar3;
  
  pcVar2 = (ls->sb).e;
  uVar3 = (ulong)vg & 0xffffffff;
  pcVar2[uVar3 * 8 + 1] = in_DL;
  if (pcVar2[uVar3 * 8] == 'X') {
    uVar1 = *(ushort *)((ls->sb).e + uVar3 * 8 + 2);
    list = ((BCPos)vg + (uint)uVar1) - 0x7fff;
    if (list != 0xffffffff && uVar1 != 0x7fff) {
      jmp_patch((FuncState *)ls,list,(BCPos)vg);
    }
    pcVar2[uVar3 * 8] = '2';
    (pcVar2 + uVar3 * 8 + 2)[0] = -1;
    (pcVar2 + uVar3 * 8 + 2)[1] = '\x7f';
  }
  return;
}

Assistant:

static void gola_close(LexState *ls, VarInfo *vg)
{
  FuncState *fs = ls->fs;
  BCPos pc = vg->startpc;
  BCIns *ip = &fs->bcbase[pc].ins;
  lj_assertFS(gola_isgoto(vg), "expected goto");
  lj_assertFS(bc_op(*ip) == BC_JMP || bc_op(*ip) == BC_UCLO,
	      "bad bytecode op %d", bc_op(*ip));
  setbc_a(ip, vg->slot);
  if (bc_op(*ip) == BC_JMP) {
    BCPos next = jmp_next(fs, pc);
    if (next != NO_JMP) jmp_patch(fs, next, pc);  /* Jump to UCLO. */
    setbc_op(ip, BC_UCLO);  /* Turn into UCLO. */
    setbc_j(ip, NO_JMP);
  }
}